

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O0

ScalarFunction * duckdb::GetBitFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *func;
  allocator_type *in_stack_fffffffffffffdf8;
  BaseScalarFunction *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe00;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  LogicalType *local_1a0;
  BaseScalarFunction local_180 [176];
  LogicalType local_d0 [24];
  undefined1 local_b8 [32];
  LogicalType local_98 [40];
  LogicalType *local_70;
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  local_70 = local_68;
  duckdb::LogicalType::LogicalType(local_70,BIT);
  local_70 = local_50;
  duckdb::LogicalType::LogicalType(local_70,INTEGER);
  local_38 = local_68;
  local_30 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbcfccd);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffe10;
  iVar1._M_array = (iterator)in_stack_fffffffffffffe08;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffe14;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe00,iVar1,in_stack_fffffffffffffdf8);
  duckdb::LogicalType::LogicalType(local_98,INTEGER);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
            );
  duckdb::LogicalType::LogicalType(local_d0,INVALID);
  function = (BaseScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(in_RDI,local_28,local_98,local_b8,0);
  duckdb::LogicalType::~LogicalType(local_d0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbcfda4);
  duckdb::LogicalType::~LogicalType(local_98);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbcfdbe);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbcfdcb);
  local_1a0 = (LogicalType *)&local_38;
  do {
    local_1a0 = local_1a0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_1a0);
  } while (local_1a0 != local_68);
  BaseScalarFunction::SetReturnsError(function);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_180);
  return in_RDI;
}

Assistant:

ScalarFunction GetBitFun::GetFunction() {
	ScalarFunction func({LogicalType::BIT, LogicalType::INTEGER}, LogicalType::INTEGER,
	                    ScalarFunction::BinaryFunction<string_t, int32_t, int32_t, GetBitOperator>);
	BaseScalarFunction::SetReturnsError(func);
	return func;
}